

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgmsg.cpp
# Opt level: O0

int DBG_change_entrylevel(int new_level)

{
  FILE *__stream;
  uint __errnum;
  void *pvVar1;
  char *pcVar2;
  int ret;
  int old_level;
  int new_level_local;
  
  if (max_entry_level == 0) {
    old_level = 0;
  }
  else {
    pvVar1 = pthread_getspecific(entry_level_key);
    old_level = (int)pvVar1;
    if ((new_level != -1) &&
       (__errnum = pthread_setspecific(entry_level_key,(void *)(long)new_level), __stream = _stderr,
       __errnum != 0)) {
      pcVar2 = strerror(__errnum);
      fprintf(__stream,"ERROR : pthread_setspecific() failed error:%d (%s)\n",(ulong)__errnum,pcVar2
             );
    }
  }
  return old_level;
}

Assistant:

int DBG_change_entrylevel(int new_level)
{
    int old_level;
    int ret;

    if(0 == max_entry_level)
    {
        return 0;
    }
    old_level = PtrToInt(pthread_getspecific(entry_level_key));
    if(-1 != new_level)
    {
        if ((ret = pthread_setspecific(entry_level_key,(LPVOID)(IntToPtr(new_level)))) != 0)
        {
            fprintf(stderr, "ERROR : pthread_setspecific() failed "
                    "error:%d (%s)\n", ret, strerror(ret));
        }
    }
    return old_level;
}